

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  element_type *peVar6;
  long in_RDI;
  Colour colour;
  undefined4 in_stack_ffffffffffffff68;
  Code in_stack_ffffffffffffff6c;
  ostream *in_stack_ffffffffffffff70;
  
  poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),'\n');
  pcVar4 = getLineOfChars<(char)126>();
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,'\n');
  Colour::Colour((Colour *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  poVar3 = *(ostream **)(in_RDI + 0x18);
  psVar5 = (string *)
           Option<Catch::TestRunInfo>::operator->((Option<Catch::TestRunInfo> *)(in_RDI + 0x20));
  poVar3 = std::operator<<(poVar3,psVar5);
  std::operator<<(poVar3," is a Catch v");
  libraryVersion();
  poVar3 = Catch::operator<<(in_stack_ffffffffffffff70,
                             (Version *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  poVar3 = std::operator<<(poVar3," host application.\n");
  std::operator<<(poVar3,"Run with -? for options\n\n");
  peVar6 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13c99a);
  iVar1 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    poVar3 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Randomness seeded to: ");
    peVar6 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13c9e6);
    uVar2 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x11])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::operator<<(poVar3,"\n\n");
  }
  *(undefined1 *)(in_RDI + 0x48) = 1;
  Colour::~Colour((Colour *)0x13ca5b);
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    stream << '\n' << getLineOfChars<'~'>() << '\n';
    Colour colour(Colour::SecondaryText);
    stream << currentTestRunInfo->name
        << " is a Catch v" << libraryVersion() << " host application.\n"
        << "Run with -? for options\n\n";

    if (m_config->rngSeed() != 0)
        stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

    currentTestRunInfo.used = true;
}